

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void param(item *x)

{
  item *x_local;
  
  if (currentSymbol != 0x12d) {
    mark("missing (");
    exit(-1);
  }
  getSymbol();
  if (currentSymbol == 0x1f7) {
    loadStringLiteralToHeap(x);
    getSymbol();
  }
  else {
    simpleExpression(x);
  }
  if (currentSymbol == 0x12e) {
    getSymbol();
    return;
  }
  mark("missing right paranetheses");
  exit(-1);
}

Assistant:

procedure
void param(struct item *x) {
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
	} else {
		mark("missing (");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_STRINGLITERAL) {
		loadStringLiteralToHeap(x);
		getSymbol();
	} else {
		simpleExpression(x);
	}
	if (currentSymbol == SYMBOL_RPARAN) {
		getSymbol();
	} else {
		mark("missing right paranetheses");
		exit(-1);
	}
}